

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

double fct_ts__duration(fct_ts_t *ts)

{
  size_t sVar1;
  fct_test_t *test;
  size_t idx;
  double dVar2;
  double dVar3;
  
  if (ts != (fct_ts_t *)0x0) {
    sVar1 = (ts->test_list).used_itm_num;
    dVar2 = 0.0;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      test = (fct_test_t *)fct_nlist__at(&ts->test_list,idx);
      dVar3 = fct_test__duration(test);
      dVar2 = dVar2 + dVar3;
    }
    return dVar2;
  }
  __assert_fail("ts != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x54e,
                "double fct_ts__duration(const fct_ts_t *)");
}

Assistant:

static double
fct_ts__duration(fct_ts_t const *ts)
{
    double tally =0.0;
    FCT_ASSERT( ts != NULL );
    FCT_NLIST_FOREACH_BGN(fct_test_t *, test, &(ts->test_list))
    {
        tally += fct_test__duration(test);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}